

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O2

Type __thiscall FIX::DataDictionary::XMLTypeToType(DataDictionary *this,string *type)

{
  bool bVar1;
  Type TVar2;
  
  bVar1 = std::operator<(&(this->m_beginString).super_StringField.super_FieldBase.m_string,"FIX.4.2"
                        );
  TVar2 = String;
  if (((!bVar1) || (bVar1 = std::operator==(type,"CHAR"), !bVar1)) &&
     (bVar1 = std::operator==(type,"STRING"), !bVar1)) {
    bVar1 = std::operator==(type,"CHAR");
    if (bVar1) {
      TVar2 = Char;
    }
    else {
      bVar1 = std::operator==(type,"PRICE");
      if (bVar1) {
        TVar2 = Price;
      }
      else {
        bVar1 = std::operator==(type,"INT");
        if (bVar1) {
          TVar2 = Int;
        }
        else {
          bVar1 = std::operator==(type,"AMT");
          if (bVar1) {
            TVar2 = Amt;
          }
          else {
            bVar1 = std::operator==(type,"QTY");
            if (bVar1) {
              TVar2 = Qty;
            }
            else {
              bVar1 = std::operator==(type,"CURRENCY");
              if (bVar1) {
                TVar2 = Currency;
              }
              else {
                bVar1 = std::operator==(type,"MULTIPLEVALUESTRING");
                if (bVar1) {
                  TVar2 = MultipleValueString;
                }
                else {
                  bVar1 = std::operator==(type,"MULTIPLESTRINGVALUE");
                  if (bVar1) {
                    TVar2 = MultipleStringValue;
                  }
                  else {
                    bVar1 = std::operator==(type,"MULTIPLECHARVALUE");
                    if (bVar1) {
                      TVar2 = MultipleCharValue;
                    }
                    else {
                      bVar1 = std::operator==(type,"EXCHANGE");
                      if (bVar1) {
                        TVar2 = Exchange;
                      }
                      else {
                        bVar1 = std::operator==(type,"UTCTIMESTAMP");
                        if (bVar1) {
                          TVar2 = UtcTimeStamp;
                        }
                        else {
                          bVar1 = std::operator==(type,"BOOLEAN");
                          if (bVar1) {
                            TVar2 = Boolean;
                          }
                          else {
                            bVar1 = std::operator==(type,"LOCALMKTDATE");
                            if (bVar1) {
                              TVar2 = LocalMktDate;
                            }
                            else {
                              bVar1 = std::operator==(type,"DATA");
                              if (bVar1) {
                                TVar2 = Data;
                              }
                              else {
                                bVar1 = std::operator==(type,"FLOAT");
                                if (bVar1) {
                                  TVar2 = Float;
                                }
                                else {
                                  bVar1 = std::operator==(type,"PRICEOFFSET");
                                  if (bVar1) {
                                    TVar2 = PriceOffset;
                                  }
                                  else {
                                    bVar1 = std::operator==(type,"MONTHYEAR");
                                    if (bVar1) {
                                      TVar2 = MonthYear;
                                    }
                                    else {
                                      bVar1 = std::operator==(type,"DAYOFMONTH");
                                      if (bVar1) {
                                        TVar2 = DayOfMonth;
                                      }
                                      else {
                                        bVar1 = std::operator==(type,"UTCDATE");
                                        TVar2 = UtcDate;
                                        if ((!bVar1) &&
                                           (bVar1 = std::operator==(type,"UTCDATEONLY"), !bVar1)) {
                                          bVar1 = std::operator==(type,"UTCTIMEONLY");
                                          if (bVar1) {
                                            TVar2 = UtcTimeOnly;
                                          }
                                          else {
                                            bVar1 = std::operator==(type,"NUMINGROUP");
                                            if (bVar1) {
                                              TVar2 = NumInGroup;
                                            }
                                            else {
                                              bVar1 = std::operator==(type,"PERCENTAGE");
                                              if (bVar1) {
                                                TVar2 = Percentage;
                                              }
                                              else {
                                                bVar1 = std::operator==(type,"SEQNUM");
                                                if (bVar1) {
                                                  TVar2 = SeqNum;
                                                }
                                                else {
                                                  bVar1 = std::operator==(type,"LENGTH");
                                                  if (bVar1) {
                                                    TVar2 = Length;
                                                  }
                                                  else {
                                                    bVar1 = std::operator==(type,"COUNTRY");
                                                    if (bVar1) {
                                                      TVar2 = Country;
                                                    }
                                                    else {
                                                      bVar1 = std::operator==(type,"TIME");
                                                      TVar2 = UtcTimeStamp;
                                                      if (!bVar1) {
                                                        TVar2 = Unknown;
                                                      }
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return TVar2;
}

Assistant:

TYPE::Type DataDictionary::XMLTypeToType(const std::string &type) const {
  if (m_beginString < "FIX.4.2" && type == "CHAR") {
    return TYPE::String;
  }

  if (type == "STRING") {
    return TYPE::String;
  }
  if (type == "CHAR") {
    return TYPE::Char;
  }
  if (type == "PRICE") {
    return TYPE::Price;
  }
  if (type == "INT") {
    return TYPE::Int;
  }
  if (type == "AMT") {
    return TYPE::Amt;
  }
  if (type == "QTY") {
    return TYPE::Qty;
  }
  if (type == "CURRENCY") {
    return TYPE::Currency;
  }
  if (type == "MULTIPLEVALUESTRING") {
    return TYPE::MultipleValueString;
  }
  if (type == "MULTIPLESTRINGVALUE") {
    return TYPE::MultipleStringValue;
  }
  if (type == "MULTIPLECHARVALUE") {
    return TYPE::MultipleCharValue;
  }
  if (type == "EXCHANGE") {
    return TYPE::Exchange;
  }
  if (type == "UTCTIMESTAMP") {
    return TYPE::UtcTimeStamp;
  }
  if (type == "BOOLEAN") {
    return TYPE::Boolean;
  }
  if (type == "LOCALMKTDATE") {
    return TYPE::LocalMktDate;
  }
  if (type == "DATA") {
    return TYPE::Data;
  }
  if (type == "FLOAT") {
    return TYPE::Float;
  }
  if (type == "PRICEOFFSET") {
    return TYPE::PriceOffset;
  }
  if (type == "MONTHYEAR") {
    return TYPE::MonthYear;
  }
  if (type == "DAYOFMONTH") {
    return TYPE::DayOfMonth;
  }
  if (type == "UTCDATE") {
    return TYPE::UtcDate;
  }
  if (type == "UTCDATEONLY") {
    return TYPE::UtcDateOnly;
  }
  if (type == "UTCTIMEONLY") {
    return TYPE::UtcTimeOnly;
  }
  if (type == "NUMINGROUP") {
    return TYPE::NumInGroup;
  }
  if (type == "PERCENTAGE") {
    return TYPE::Percentage;
  }
  if (type == "SEQNUM") {
    return TYPE::SeqNum;
  }
  if (type == "LENGTH") {
    return TYPE::Length;
  }
  if (type == "COUNTRY") {
    return TYPE::Country;
  }
  if (type == "TIME") {
    return TYPE::UtcTimeStamp;
  }
  return TYPE::Unknown;
}